

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_enc.c
# Opt level: O0

void VP8TBufferClear(VP8TBuffer *b)

{
  VP8TBuffer *in_RDI;
  VP8Tokens *next;
  VP8Tokens *p;
  VP8Tokens *local_10;
  
  if (in_RDI != (VP8TBuffer *)0x0) {
    local_10 = in_RDI->pages_;
    while (local_10 != (VP8Tokens *)0x0) {
      local_10 = local_10->next_;
      WebPSafeFree((void *)0x183c2c);
    }
    VP8TBufferInit(in_RDI,in_RDI->page_size_);
  }
  return;
}

Assistant:

void VP8TBufferClear(VP8TBuffer* const b) {
  if (b != NULL) {
    VP8Tokens* p = b->pages_;
    while (p != NULL) {
      VP8Tokens* const next = p->next_;
      WebPSafeFree(p);
      p = next;
    }
    VP8TBufferInit(b, b->page_size_);
  }
}